

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::FiberPool::Impl::~Impl(Impl *this)

{
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *this_00;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *__x;
  _Elt_pointer ppFVar1;
  uint uVar2;
  FiberStack *pFVar3;
  long lVar4;
  _Elt_pointer ppFVar5;
  CoreLocalFreelist *pCVar6;
  long lVar7;
  ulong uVar8;
  _Map_pointer pppFVar9;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> dangling;
  _Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> local_80;
  
  pCVar6 = this->coreLocalFreelists;
  if (pCVar6 != (CoreLocalFreelist *)0x0) {
    uVar2 = this->nproc;
    if ((ulong)uVar2 != 0) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        pCVar6 = this->coreLocalFreelists;
        lVar4 = 0;
        do {
          pFVar3 = *(FiberStack **)((long)&pCVar6->field_0 + lVar4 + lVar7);
          if (pFVar3 != (FiberStack *)0x0) {
            kj::_::FiberStack::~FiberStack(pFVar3);
            operator_delete(pFVar3,0x20);
          }
          lVar4 = lVar4 + 8;
        } while (lVar4 != 0x10);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x40;
      } while (uVar8 != uVar2);
      pCVar6 = this->coreLocalFreelists;
    }
    free(pCVar6);
  }
  this_00 = &this->freelist;
  local_80._M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
  kj::_::Mutex::lock(&this_00->mutex,0);
  __x = &(this->freelist).value;
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::_Deque_base
            (&local_80,
             &__x->super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>);
  ppFVar5 = local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppFVar1 = local_80._M_impl.super__Deque_impl_data._M_start._M_last;
  pppFVar9 = local_80._M_impl.super__Deque_impl_data._M_start._M_node;
  while (ppFVar5 != local_80._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pFVar3 = *ppFVar5;
    if (pFVar3 != (FiberStack *)0x0) {
      kj::_::FiberStack::~FiberStack(pFVar3);
    }
    operator_delete(pFVar3,0x20);
    ppFVar5 = ppFVar5 + 1;
    if (ppFVar5 == ppFVar1) {
      ppFVar5 = pppFVar9[1];
      pppFVar9 = pppFVar9 + 1;
      ppFVar1 = ppFVar5 + 0x40;
    }
  }
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::~_Deque_base
            (&local_80);
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::~_Deque_base
            (&__x->super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>);
  kj::_::Mutex::~Mutex(&this_00->mutex);
  return;
}

Assistant:

~Impl() noexcept(false) {
#if USE_CORE_LOCAL_FREELISTS
    if (coreLocalFreelists != nullptr) {
      KJ_DEFER(free(coreLocalFreelists));

      for (uint i: kj::zeroTo(nproc)) {
        for (auto stack: coreLocalFreelists[i].stacks) {
          if (stack != nullptr) {
            delete stack;
          }
        }
      }
    }
#endif

    // Make sure we're not leaking anything from the global freelist either.
    auto lock = freelist.lockExclusive();
    auto dangling = kj::mv(*lock);
    for (auto& stack: dangling) {
      delete stack;
    }
  }